

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

size_type anon_unknown.dwarf_14c2e::filename_pos(string_type *str,size_type end_pos)

{
  long lVar1;
  char *pcVar2;
  
  if (end_pos != 0) {
    if (end_pos == 2) {
      pcVar2 = (str->_M_dataplus)._M_p;
      if ((*pcVar2 == '/') && (pcVar2[1] == '/')) {
        return 0;
      }
    }
    else {
      pcVar2 = (str->_M_dataplus)._M_p;
    }
    if (pcVar2[end_pos - 1] == '/') {
      return end_pos - 1;
    }
  }
  lVar1 = std::__cxx11::string::find_last_of((char *)str,0x11301d);
  if ((lVar1 != -1) && ((lVar1 != 1 || (*(str->_M_dataplus)._M_p != '/')))) {
    return lVar1 + 1;
  }
  return 0;
}

Assistant:

size_type filename_pos(const string_type & str,
                          size_type end_pos) // end_pos is past-the-end position
    // return 0 if str itself is filename (or empty)
  {
    // case: "//"
    if (end_pos == 2 
      && is_separator(str[0])
      && is_separator(str[1])) return 0;

    // case: ends in "/"
    if (end_pos && is_separator(str[end_pos-1]))
      return end_pos-1;
    
    // set pos to start of last element
    size_type pos(str.find_last_of(separators, end_pos-1));

#   ifdef BOOST_WINDOWS_API
    if (pos == string_type::npos && end_pos > 1)
      pos = str.find_last_of(colon, end_pos-2);
#   endif

    return (pos == string_type::npos // path itself must be a filename (or empty)
      || (pos == 1 && is_separator(str[0]))) // or net
        ? 0 // so filename is entire string
        : pos + 1; // or starts after delimiter
  }